

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

bool __thiscall
benchmark::internal::BenchmarkFamilies::FindBenchmarks
          (BenchmarkFamilies *this,string *spec,
          vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
          *benchmarks)

{
  bool bVar1;
  ostream *poVar2;
  pointer pBVar3;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_00;
  reference ppVar4;
  reference piVar5;
  vector<int,_std::allocator<int>_> *local_1e8;
  string local_1b8;
  string local_198;
  undefined1 local_178 [8];
  Instance instance;
  const_iterator cStack_120;
  int num_threads;
  const_iterator __end4;
  const_iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  vector<int,_std::allocator<int>_> *thread_counts;
  pair<int,_int> *args;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range3;
  BenchmarkImp *local_d8;
  BenchmarkImp *family;
  unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
  *bench_family;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>
  *__range2;
  MutexLock l;
  undefined1 local_98 [8];
  vector<int,_std::allocator<int>_> one_thread;
  undefined1 local_70 [8];
  Regex re;
  string error_msg;
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  *benchmarks_local;
  string *spec_local;
  BenchmarkFamilies *this_local;
  
  std::__cxx11::string::string
            ((string *)
             &re.re_._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  Regex::Regex((Regex *)local_70);
  bVar1 = Regex::Init((Regex *)local_70,spec,
                      (string *)
                      &re.re_._M_automaton.
                       super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
  if (bVar1) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_98);
    l.ml_._12_4_ = 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_98,
               (value_type_conflict1 *)&l.ml_.field_0xc);
    MutexLock::MutexLock((MutexLock *)&__range2,&this->mutex_);
    __end2 = std::
             vector<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>
             ::begin(&this->families_);
    bench_family = (unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
                    *)std::
                      vector<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>
                      ::end(&this->families_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_*,_std::vector<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>_>
                                       *)&bench_family), bVar1) {
      family = (BenchmarkImp *)
               __gnu_cxx::
               __normal_iterator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_*,_std::vector<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>_>
               ::operator*(&__end2);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)family);
      if (bVar1) {
        pBVar3 = std::
                 unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
                 ::operator->((unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
                               *)family);
        local_d8 = pBVar3->imp_;
        if (local_d8->arg_count_ == -1) {
          local_d8->arg_count_ = 0;
          __range3._4_4_ = 0xffffffff;
          __range3._0_4_ = 0xffffffff;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                     &local_d8->args_,(int *)((long)&__range3 + 4),(int *)&__range3);
        }
        this_00 = &local_d8->args_;
        __end3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                           (this_00);
        args = (pair<int,_int> *)
               std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(this_00)
        ;
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                           *)&args), bVar1) {
          ppVar4 = __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator*(&__end3);
          bVar1 = std::vector<int,_std::allocator<int>_>::empty(&local_d8->thread_counts_);
          if (bVar1) {
            local_1e8 = (vector<int,_std::allocator<int>_> *)local_98;
          }
          else {
            local_1e8 = &local_d8->thread_counts_;
          }
          __end4 = std::vector<int,_std::allocator<int>_>::begin(local_1e8);
          cStack_120 = std::vector<int,_std::allocator<int>_>::end(local_1e8);
          while (bVar1 = __gnu_cxx::operator!=(&__end4,&stack0xfffffffffffffee0), bVar1) {
            piVar5 = __gnu_cxx::
                     __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&__end4);
            instance._76_4_ = *piVar5;
            Benchmark::Instance::Instance((Instance *)local_178);
            std::__cxx11::string::operator=((string *)local_178,(string *)local_d8);
            instance.name.field_2._8_8_ =
                 std::
                 unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
                 ::get((unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>
                        *)family);
            instance.benchmark._0_1_ = 0 < local_d8->arg_count_;
            instance.benchmark._4_4_ = ppVar4->first;
            instance.has_arg1 = local_d8->arg_count_ == 2;
            instance.arg1 = ppVar4->second;
            instance._56_8_ = local_d8->min_time_;
            instance.has_arg2 = (bool)(local_d8->use_real_time_ & 1);
            instance.min_time._0_4_ = instance._76_4_;
            bVar1 = std::vector<int,_std::allocator<int>_>::empty(&local_d8->thread_counts_);
            instance.min_time._4_1_ = (bVar1 ^ 0xffU) & 1;
            if (0 < local_d8->arg_count_) {
              AppendHumanReadable(instance.benchmark._4_4_,(string *)local_178);
            }
            if (1 < local_d8->arg_count_) {
              AppendHumanReadable(instance.arg1,(string *)local_178);
            }
            bVar1 = anon_unknown_1::IsZero(local_d8->min_time_);
            if (!bVar1) {
              StringPrintF_abi_cxx11_(&local_198,"/min_time:%0.3f",local_d8->min_time_);
              std::__cxx11::string::operator+=((string *)local_178,(string *)&local_198);
              std::__cxx11::string::~string((string *)&local_198);
            }
            if ((local_d8->use_real_time_ & 1U) != 0) {
              std::__cxx11::string::operator+=((string *)local_178,"/real_time");
            }
            bVar1 = std::vector<int,_std::allocator<int>_>::empty(&local_d8->thread_counts_);
            if (!bVar1) {
              StringPrintF_abi_cxx11_(&local_1b8,"/threads:%d",(ulong)instance.min_time._0_4_);
              std::__cxx11::string::operator+=((string *)local_178,(string *)&local_1b8);
              std::__cxx11::string::~string((string *)&local_1b8);
            }
            bVar1 = Regex::Match((Regex *)local_70,(string *)local_178);
            if (bVar1) {
              std::
              vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
              ::push_back(benchmarks,(value_type *)local_178);
            }
            Benchmark::Instance::~Instance((Instance *)local_178);
            __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
            operator++(&__end4);
          }
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator++(&__end3);
        }
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_*,_std::vector<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>,_std::allocator<std::unique_ptr<benchmark::internal::Benchmark,_std::default_delete<benchmark::internal::Benchmark>_>_>_>_>
      ::operator++(&__end2);
    }
    this_local._7_1_ = true;
    one_thread.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 1;
    MutexLock::~MutexLock((MutexLock *)&__range2);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_98);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Could not compile benchmark re: ");
    poVar2 = std::operator<<(poVar2,(string *)
                                    &re.re_._M_automaton.
                                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
    one_thread.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 1;
  }
  Regex::~Regex((Regex *)local_70);
  std::__cxx11::string::~string
            ((string *)
             &re.re_._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return this_local._7_1_;
}

Assistant:

bool BenchmarkFamilies::FindBenchmarks(
    const std::string& spec,
    std::vector<Benchmark::Instance>* benchmarks) {
  // Make regular expression out of command-line flag
  std::string error_msg;
  Regex re;
  if (!re.Init(spec, &error_msg)) {
    std::cerr << "Could not compile benchmark re: " << error_msg << std::endl;
    return false;
  }

  // Special list of thread counts to use when none are specified
  std::vector<int> one_thread;
  one_thread.push_back(1);

  MutexLock l(mutex_);
  for (std::unique_ptr<Benchmark>& bench_family : families_) {
    // Family was deleted or benchmark doesn't match
    if (!bench_family) continue;
    BenchmarkImp* family = bench_family->imp_;

    if (family->arg_count_ == -1) {
      family->arg_count_ = 0;
      family->args_.emplace_back(-1, -1);
    }
    for (auto const& args : family->args_) {
      const std::vector<int>* thread_counts =
        (family->thread_counts_.empty()
         ? &one_thread
         : &family->thread_counts_);
      for (int num_threads : *thread_counts) {

        Benchmark::Instance instance;
        instance.name = family->name_;
        instance.benchmark = bench_family.get();
        instance.has_arg1 = family->arg_count_ >= 1;
        instance.arg1 = args.first;
        instance.has_arg2 = family->arg_count_ == 2;
        instance.arg2 = args.second;
        instance.min_time = family->min_time_;
        instance.use_real_time = family->use_real_time_;
        instance.threads = num_threads;
        instance.multithreaded = !(family->thread_counts_.empty());

        // Add arguments to instance name
        if (family->arg_count_ >= 1) {
          AppendHumanReadable(instance.arg1, &instance.name);
        }
        if (family->arg_count_ >= 2) {
          AppendHumanReadable(instance.arg2, &instance.name);
        }
        if (!IsZero(family->min_time_)) {
          instance.name +=  StringPrintF("/min_time:%0.3f",  family->min_time_);
        }
        if (family->use_real_time_) {
          instance.name +=  "/real_time";
        }

        // Add the number of threads used to the name
        if (!family->thread_counts_.empty()) {
          instance.name += StringPrintF("/threads:%d", instance.threads);
        }

        if (re.Match(instance.name)) {
          benchmarks->push_back(instance);
        }
      }
    }
  }
  return true;
}